

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *lhs,vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               *rhs)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  AssertionResult AVar3;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  *rhs_local;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  *lhs_local;
  char *rhs_expression_local;
  char *lhs_expression_local;
  
  bVar1 = std::operator==(lhs,rhs);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    AVar3 = CmpHelperEQFailure<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}